

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_capacity_valid_fn(int _i)

{
  size_t sVar1;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  memset(&_ck_x,0,0x28);
  string.size = 0x2a;
  sVar1 = AString_capacity((AString *)&_ck_x);
  if (sVar1 != 0x2a) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x11b,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "AString_capacity(&string) == 42","AString_capacity(&string)",sVar1,"42",0x2a,
                      0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x11b);
  string.size = 0xd;
  sVar1 = AString_capacity((AString *)&_ck_x);
  if (sVar1 == 0xd) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x11d);
    string.size = 0;
    sVar1 = AString_capacity((AString *)&_ck_x);
    if (sVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x11f);
      return;
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x11f,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "AString_capacity(&string) == 0","AString_capacity(&string)",sVar1,"0",0,0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x11d,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "AString_capacity(&string) == 13","AString_capacity(&string)",sVar1,"13",0xd,0);
}

Assistant:

START_TEST(test_AString_capacity_valid)
{
    struct AString string = {nullptr, nullptr};
    string.capacity = 42;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 42);
    string.capacity = 13;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 13);
    string.capacity = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 0);
}